

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O1

bool google::protobuf::compiler::java::anon_unknown_16::BitfieldTracksMutability
               (FieldDescriptor *descriptor)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool bVar3;
  
  bVar1 = descriptor->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    java::_GLOBAL__N_1::BitfieldTracksMutability();
  }
  if ((descriptor->field_0x1 & 0x20) == 0) {
LAB_00ea183e:
    bVar3 = false;
  }
  else {
    if (descriptor->type_ == '\v') {
      bVar3 = FieldDescriptor::is_map_message_type(descriptor);
      if (bVar3) goto LAB_00ea183e;
    }
    bVar3 = (descriptor->type_ & 0xfe) == 10;
  }
  return bVar3;
}

Assistant:

bool BitfieldTracksMutability(const FieldDescriptor* const descriptor) {
  if (!descriptor->is_repeated() || IsMapField(descriptor)) {
    return false;
  }
  // TODO: update this to migrate repeated fields to use
  // ProtobufList (which tracks immutability internally). That allows us to use
  // the presence bit to skip work on the repeated field if it is not populated.
  // Once all repeated fields are held in ProtobufLists, this method shouldn't
  // be needed.
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return true;
    default:
      return false;
  }
}